

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O2

int Sto_ManMemoryReport(Sto_Man_t *p)

{
  int iVar1;
  long *plVar2;
  
  plVar2 = (long *)p->pChunkLast;
  if (plVar2 == (long *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = p->nChunkUsed;
    while (plVar2 = (long *)*plVar2, plVar2 != (long *)0x0) {
      iVar1 = iVar1 + p->nChunkSize;
    }
  }
  return iVar1;
}

Assistant:

int Sto_ManMemoryReport( Sto_Man_t * p )
{
    int Total;
    char * pMem, * pNext;
    if ( p->pChunkLast == NULL )
        return 0;
    Total = p->nChunkUsed; 
    for ( pMem = p->pChunkLast; (pNext = *(char **)pMem); pMem = pNext )
        Total += p->nChunkSize;
    return Total;
}